

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMRangeImpl::setEndBefore(DOMRangeImpl *this,DOMNode *refNode)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  DOMNode *n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLSize_t XVar4;
  DOMNode *pDVar5;
  DOMException *this_00;
  code *pcVar6;
  pointer_____offset_0x10___ *ppuVar7;
  DOMRangeImpl *this_01;
  long lVar8;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,this->fMemoryManager);
LAB_002872a7:
    ppuVar7 = &DOMException::typeinfo;
    pcVar6 = DOMException::~DOMException;
  }
  else {
    this_01 = this;
    bVar2 = hasLegalRootContainer(this,refNode);
    if (bVar2) {
      bVar2 = isLegalContainedNode(this_01,refNode);
      if (bVar2) {
        pDVar1 = this->fDocument;
        iVar3 = (*refNode->_vptr_DOMNode[0xc])(refNode);
        if (pDVar1 == (DOMDocument *)CONCAT44(extraout_var,iVar3)) {
LAB_002871aa:
          iVar3 = (*refNode->_vptr_DOMNode[5])(refNode);
          this->fEndContainer = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
          lVar8 = 0;
          pDVar5 = refNode;
          while (pDVar5 != (DOMNode *)0x0) {
            iVar3 = (*pDVar5->_vptr_DOMNode[9])(pDVar5);
            lVar8 = lVar8 + 1;
            pDVar5 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
          }
          XVar4 = 0;
          if (lVar8 != 0) {
            XVar4 = lVar8 - 1;
          }
          this->fEndOffset = XVar4;
          pDVar5 = commonAncestorOf(this,refNode,this->fStartContainer);
          if (pDVar5 == (DOMNode *)0x0) {
            (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
          }
          iVar3 = (*(this->super_DOMRange)._vptr_DOMRange[0x11])(this,3,this);
          if ((short)iVar3 == 1) {
            (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
            return;
          }
          this->fCollapsed = false;
          return;
        }
        pDVar5 = &this->fDocument->super_DOMNode;
        if (this->fDocument == (DOMDocument *)0x0) {
          pDVar5 = (DOMNode *)0x0;
        }
        if (pDVar5 == refNode) goto LAB_002871aa;
        (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
        this->fCollapsed = true;
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,4,0,this->fMemoryManager);
        goto LAB_002872a7;
      }
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMRangeException::DOMRangeException((DOMRangeException *)this_00,0x70,0,this->fMemoryManager);
    ppuVar7 = &DOMRangeException::typeinfo;
    pcVar6 = DOMRangeException::~DOMRangeException;
  }
  __cxa_throw(this_00,ppuVar7,pcVar6);
}

Assistant:

void DOMRangeImpl::setEndBefore(const DOMNode* refNode)
{
    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }
    if ( !hasLegalRootContainer(refNode) || !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // error if not the same owner document
    if (fDocument != refNode->getOwnerDocument()) {
        if ( refNode != fDocument ) {
            collapse(false); //collapse the range positions to end
            fCollapsed = true;
            throw DOMException(
                DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
        }
    }

    fEndContainer = refNode->getParentNode();
    XMLSize_t i = 0;
    for (DOMNode* n = (DOMNode*) refNode; n!=0; n = n->getPreviousSibling(), i++) ;

    if (i< 1)
        fEndOffset = 0;
    else
        fEndOffset = i-1;

    // they may be of same document, but not same root container
    // collapse if not the same root container
    if (!commonAncestorOf(refNode, fStartContainer))
        collapse(false);

    //compare the start and end boundary point
    //collapse if start point is after the end point
    if(compareBoundaryPoints(DOMRange::END_TO_START, this) == 1)
        collapse(false); //collapse the range positions to end
    else
        fCollapsed = false;
}